

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Get_Bitmap(FT_Library library,FT_Outline *outline,FT_Bitmap *abitmap)

{
  FT_Error FVar1;
  FT_Raster_Params params;
  FT_Raster_Params local_60;
  
  if (abitmap != (FT_Bitmap *)0x0) {
    local_60.flags = 0;
    if ((abitmap->pixel_mode < 7) && ((100U >> (abitmap->pixel_mode & 0x1f) & 1) != 0)) {
      local_60.flags = 1;
    }
    local_60.target = abitmap;
    FVar1 = FT_Outline_Render(library,outline,&local_60);
    return FVar1;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Get_Bitmap( FT_Library        library,
                         FT_Outline*       outline,
                         const FT_Bitmap  *abitmap )
  {
    FT_Raster_Params  params;


    if ( !abitmap )
      return FT_THROW( Invalid_Argument );

    /* other checks are delayed to `FT_Outline_Render' */

    params.target = abitmap;
    params.flags  = 0;

    if ( abitmap->pixel_mode == FT_PIXEL_MODE_GRAY  ||
         abitmap->pixel_mode == FT_PIXEL_MODE_LCD   ||
         abitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      params.flags |= FT_RASTER_FLAG_AA;

    return FT_Outline_Render( library, outline, &params );
  }